

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int error(int argc,char **argv)

{
  int iVar1;
  char *__s;
  undefined1 auVar2 [16];
  Point2i resolution;
  bool bVar3;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pAVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  Allocator AVar14;
  allocator_type aVar15;
  pointer pdVar16;
  int64_t *piVar17;
  ulong uVar18;
  uint uVar19;
  value_type *mcve_1;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *pvVar20;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *pAVar21;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *__range2;
  pointer this;
  long lVar22;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  value_type *mcve;
  ulong uVar23;
  int iVar24;
  long lVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  undefined8 in_XMM3_Qb;
  span<int> out;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  array<int,_4UL> cropWindow;
  string metric;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  pixelVariance;
  string filenameBase;
  string errorFile;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  pixelVariances;
  string referenceFile;
  vector<double,_std::allocator<double>_> sumErrors;
  vector<int,_std::allocator<int>_> spp;
  anon_class_8_1_e625a05e crop;
  ImageAndMetadata ref;
  Image errorImage;
  char **local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a0;
  undefined1 local_688 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_650;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  local_648;
  string local_628;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string local_5c8;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  vector<double,_std::allocator<double>_> local_570;
  long *local_558 [2];
  long local_548 [2];
  undefined1 local_538 [16];
  code *local_528;
  code *local_520;
  _Any_data local_518;
  code *local_508;
  code *local_500;
  _Any_data local_4f8;
  code *local_4e8;
  code *local_4e0;
  vector<int,_std::allocator<int>_> local_4d8;
  anon_class_8_1_e625a05e local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  long *local_498;
  undefined8 uStack_490;
  code *pcStack_488;
  code *pcStack_480;
  undefined1 local_470 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  polymorphic_allocator<unsigned_char> local_3b8;
  uchar *local_3b0;
  size_t local_3a8;
  size_t local_3a0;
  polymorphic_allocator<pbrt::Half> local_398;
  Half *local_390;
  size_t local_388;
  size_t local_380;
  polymorphic_allocator<float> local_378;
  float *local_370;
  size_t local_368;
  size_t local_360;
  bool local_354;
  bool local_310;
  bool local_2cc;
  bool local_2b8;
  bool local_2ac;
  bool local_2a4;
  bool local_29c;
  bool local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_288;
  ColorEncodingHandle local_258;
  ColorEncodingHandle local_250;
  undefined1 local_248 [72];
  ulong uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined1 auStack_1c0 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_1b8;
  ulong uStack_1a8;
  undefined1 auStack_1a0 [8];
  optional<int> oStack_198;
  optional<float> oStack_190;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_188;
  ulong uStack_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_178;
  _Any_data local_148;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  IStack_138;
  long *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 local_58;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  local_590._M_string_length = 0;
  local_590.field_2._M_local_buf[0] = '\0';
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  local_5e8._M_string_length = 0;
  local_5e8.field_2._M_local_buf[0] = '\0';
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  local_6a8 = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_688 + 0x18),"MSE","");
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  local_608._M_string_length = 0;
  local_608.field_2._M_local_buf[0] = '\0';
  local_688._0_8_ = (pointer)0xffffffff;
  local_688._8_8_ = 0xffffffff;
  if (*local_6a8 != (char *)0x0) {
    local_650 = &local_5c8.field_2;
    do {
      local_470._0_8_ = &local_460;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"reference","");
      local_4b8 = (_Any_data)0x0;
      local_4a0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                  ::_M_invoke;
      local_4a8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                  ::_M_manager;
      bVar10 = pbrt::ParseArg<std::__cxx11::string*>
                         (&local_6a8,(string *)local_470,&local_590,
                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                           *)&local_4b8);
      bVar12 = true;
      if (bVar10) {
LAB_001f0607:
        bVar11 = false;
        bVar3 = false;
      }
      else {
        local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"errorfile","");
        local_4f8 = (_Any_data)0x0;
        local_4e0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_invoke;
        local_4e8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_manager;
        bVar11 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_6a8,&local_628,&local_5e8,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_4f8);
        if (bVar11) goto LAB_001f0607;
        local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"metric","");
        local_518 = (_Any_data)0x0;
        local_500 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_invoke;
        local_508 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                    ::_M_manager;
        bVar12 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_6a8,&local_5c8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_688 + 0x18),
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_518);
        if (bVar12) {
          bVar3 = true;
          bVar11 = false;
          bVar12 = true;
        }
        else {
          local_558[0] = local_548;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"crop","");
          local_538 = (undefined1  [16])0x0;
          local_520 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                      ::_M_invoke;
          local_528 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:661:24)>
                      ::_M_manager;
          out.n = (size_t)local_538;
          out.ptr = (int *)0x4;
          bVar12 = pbrt::ParseArg<pstd::span<int>>
                             ((pbrt *)&local_6a8,(char ***)local_558,(string *)local_688,out,in_R9);
          bVar11 = true;
          bVar3 = true;
        }
      }
      if (bVar11) {
        if (local_528 != (code *)0x0) {
          (*local_528)(local_538,local_538,3);
        }
        if (local_558[0] != local_548) {
          operator_delete(local_558[0],local_548[0] + 1);
        }
      }
      if (bVar3) {
        if (local_508 != (code *)0x0) {
          (*local_508)(&local_518,&local_518,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar10) {
        if (local_4e8 != (code *)0x0) {
          (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_4a8 != (code *)0x0) {
        (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_470._0_8_ != &local_460) {
        operator_delete((void *)local_470._0_8_,(long)local_460.alloc.memoryResource + 1);
      }
      if (bVar12 == false) {
        if ((local_608._M_string_length != 0) || (__s = *local_6a8, *__s == '-')) {
          usage("error","%s: unknown argument",*local_6a8);
        }
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_608,0,(char *)0x0,(ulong)__s);
        local_6a8 = local_6a8 + 1;
      }
    } while (*local_6a8 != (char *)0x0);
  }
  if (local_608._M_string_length == 0) {
    usage("error","Must provide base filename.");
  }
  iVar13 = std::__cxx11::string::compare(local_688 + 0x18);
  if (iVar13 != 0) {
    iVar13 = std::__cxx11::string::compare(local_688 + 0x18);
    if (iVar13 != 0) {
      iVar13 = std::__cxx11::string::compare(local_688 + 0x18);
      if (iVar13 != 0) {
        usage("error","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",local_670._M_dataplus._M_p
             );
      }
    }
  }
  pbrt::MatchingFilenames(&local_6a0,&local_608);
  if (local_6a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_6a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    error();
    uVar19 = 1;
  }
  else {
    if (local_590._M_string_length == 0) {
      usage("error","must provide --reference file.");
    }
    AVar14.memoryResource = pstd::pmr::new_delete_resource();
    local_250.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_470,&local_590,AVar14,&local_250);
    if ((long)local_688._0_8_ < 0) {
      local_688._4_4_ = local_688._0_4_ - local_688._4_4_;
    }
    if ((long)local_688._8_8_ < 0) {
      local_688._12_4_ = local_688._8_4_ - local_688._12_4_;
    }
    local_4c0.cropWindow = (array<int,_4UL> *)local_688;
    error::anon_class_8_1_e625a05e::operator()(&local_4c0,(Image *)local_470);
    iVar13 = pbrt::MaxThreadIndex();
    std::
    vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
    ::vector(&local_5a8,(long)iVar13,(allocator_type *)local_148._M_pod_data);
    pAVar7 = local_5a8.
             super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_5a8.
        super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_5a8.
        super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this = local_5a8.
             super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_470._0_8_;
      do {
        uVar9 = local_470._8_4_;
        local_470._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
        uVar8 = local_470._4_4_;
        uVar23 = (ulong)(uint)local_470._8_4_;
        local_470._0_8_ = pIVar4;
        aVar15.memoryResource = pstd::pmr::new_delete_resource();
        local_248._0_4_ = (int)uVar8 >> 0x1f & uVar8;
        local_248._4_4_ = (int)uVar9 >> 0x1f & uVar9;
        uVar18 = 0;
        if (0 < (int)uVar8) {
          uVar18 = (ulong)(uint)uVar8;
        }
        if ((int)uVar9 < 1) {
          uVar23 = 0;
        }
        local_248._8_8_ = uVar18 | uVar23 << 0x20;
        pbrt::
        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
        ::Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                   *)&local_148,(Bounds2i *)local_248,aVar15);
        pbrt::
        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
        ::operator=(this,(Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                          *)&local_148);
        pbrt::
        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
        ::~Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                    *)&local_148);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
        auVar29 = vpsubd_avx(auVar27,auVar29);
        auVar27 = vpshufd_avx(auVar29,0x55);
        auVar27 = vpmulld_avx(auVar27,auVar29);
        if (auVar27._0_4_ != 0) {
          pvVar20 = this->values;
          lVar25 = (long)auVar27._0_4_ * 0x18;
          do {
            std::
            vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
            ::resize(pvVar20,(long)(int)(uint)local_460.nStored);
            pvVar20 = pvVar20 + 1;
            lVar25 = lVar25 + -0x18;
          } while (lVar25 != 0);
        }
        this = this + 1;
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_470._0_8_;
      } while (this != pAVar7);
    }
    iVar13 = pbrt::MaxThreadIndex();
    local_148._M_unused._M_object = (void *)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_570,(long)iVar13,(value_type_conflict4 *)&local_148,
               (allocator_type *)local_248);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_4d8,
               (long)local_6a0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_6a0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,
               (allocator_type *)local_148._M_pod_data);
    pbVar6 = local_6a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = local_6a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_498 = (long *)0x0;
    uStack_490 = 0;
    pcStack_488 = (code *)0x0;
    pcStack_480 = (code *)0x0;
    local_498 = (long *)operator_new(0x38);
    *local_498 = (long)&local_6a0;
    local_498[1] = (long)&local_4c0;
    local_498[2] = (long)&local_4d8;
    local_498[3] = (long)local_470;
    local_498[4] = (long)(local_688 + 0x18);
    local_498[5] = (long)&local_570;
    local_498[6] = (long)&local_5a8;
    local_148._M_unused._M_object = &local_498;
    pcStack_480 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:721:38)>
                  ::_M_invoke;
    pcStack_488 = std::
                  _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:721:38)>
                  ::_M_manager;
    local_148._8_8_ = 0;
    IStack_138.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
         ::_M_invoke;
    IStack_138.alloc.memoryResource =
         (memory_resource *)
         std::
         _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
         ::_M_manager;
    pbrt::ParallelFor(0,(long)pbVar6 - (long)pbVar5 >> 5,(function<void_(long,_long)> *)&local_148);
    if (IStack_138.alloc.memoryResource != (memory_resource *)0x0) {
      (*(code *)IStack_138.alloc.memoryResource)(&local_148,&local_148,3);
    }
    pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_470._0_8_;
    if (pcStack_488 != (code *)0x0) {
      (*pcStack_488)(&local_498,&local_498,3);
      pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_470._0_8_;
    }
    uVar9 = local_470._8_4_;
    local_470._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
    uVar8 = local_470._4_4_;
    uVar18 = (long)local_6a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_6a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    pdVar16 = local_570.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_470._0_8_ = pIVar4;
    if (1 < uVar18) {
      lVar25 = uVar18 - 1;
      lVar22 = 4;
      do {
        if (*(uint *)((long)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar22) !=
            *local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start) {
          printf("%s: spp %d mismatch. %s has %d.\n",
                 (&(local_6a0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar22]._M_p,
                 (ulong)*(uint *)((long)local_4d8.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar22),
                 ((local_6a0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
          uVar19 = 1;
          goto LAB_001f1186;
        }
        lVar22 = lVar22 + 4;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    for (; pdVar16 !=
           local_570.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish; pdVar16 = pdVar16 + 1) {
    }
    aVar15.memoryResource = pstd::pmr::new_delete_resource();
    local_148._M_unused._M_member_pointer =
         CONCAT44((int)uVar9 >> 0x1f & uVar9,(int)uVar8 >> 0x1f & uVar8);
    uVar23 = 0;
    uVar18 = 0;
    if (0 < (int)uVar8) {
      uVar18 = (ulong)(uint)uVar8;
    }
    if (0 < (int)uVar9) {
      uVar23 = (ulong)(uint)uVar9;
    }
    local_148._8_8_ = uVar18 | uVar23 << 0x20;
    pbrt::
    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::Array2D(&local_648,(Bounds2i *)&local_148,aVar15);
    auVar28._4_4_ = local_648.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    auVar28._0_4_ = local_648.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    auVar30._4_4_ = local_648.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    auVar30._0_4_ = local_648.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    auVar28._8_8_ = 0;
    auVar30._8_8_ = 0;
    auVar29 = vpsubd_avx(auVar28,auVar30);
    auVar27 = vpshufd_avx(auVar29,0x55);
    auVar27 = vpmulld_avx(auVar27,auVar29);
    pAVar21 = local_5a8.
              super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_470._0_8_;
    if (auVar27._0_4_ != 0) {
      lVar25 = (long)auVar27._0_4_ * 0x18;
      pvVar20 = local_648.values;
      do {
        std::
        vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
        resize(pvVar20,(long)(int)(uint)local_460.nStored);
        pvVar20 = pvVar20 + 1;
        lVar25 = lVar25 + -0x18;
        pAVar21 = local_5a8.
                  super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_470._0_8_;
      } while (lVar25 != 0);
    }
    for (; local_470._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20),
        pAVar21 !=
        local_5a8.
        super__Vector_base<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pAVar21 = pAVar21 + 1) {
      if (0 < (int)local_470._8_4_) {
        iVar13 = 0;
        do {
          local_470._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
          if (0 < (int)local_470._4_4_) {
            iVar24 = 0;
            do {
              if (0 < (int)(uint)local_460.nStored) {
                lVar25 = 0;
                lVar22 = 0;
                local_470._0_8_ = pIVar4;
                do {
                  iVar1 = (pAVar21->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
                  pbrt::VarianceEstimator<double>::Merge
                            ((VarianceEstimator<double> *)
                             ((long)&(local_648.values
                                      [(local_648.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                                       local_648.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                                       (iVar13 - local_648.extent.pMin.
                                                 super_Tuple2<pbrt::Point2,_int>.y) +
                                       (iVar24 - local_648.extent.pMin.
                                                 super_Tuple2<pbrt::Point2,_int>.x)].
                                      super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->mean + lVar25),
                             (VarianceEstimator<double> *)
                             ((long)&(pAVar21->values
                                      [((pAVar21->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
                                       iVar1) * (iVar13 - (pAVar21->extent).pMin.
                                                          super_Tuple2<pbrt::Point2,_int>.y) +
                                       (iVar24 - iVar1)].
                                      super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->mean + lVar25));
                  lVar22 = lVar22 + 1;
                  lVar25 = lVar25 + 0x18;
                  pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_470._0_8_;
                } while (lVar22 < (int)(uint)local_460.nStored);
              }
              local_470._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
              iVar24 = iVar24 + 1;
            } while (iVar24 < (int)local_470._4_4_);
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)local_470._8_4_);
      }
    }
    resolution.super_Tuple2<pbrt::Point2,_int>.y = local_470._8_4_;
    resolution.super_Tuple2<pbrt::Point2,_int>.x = local_470._4_4_;
    local_248._0_8_ = (long)local_248 + 0x10;
    local_470._0_8_ = pIVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_248,local_670._M_dataplus._M_p,
               local_670._M_string_length + (long)local_670._M_dataplus._M_p);
    local_258.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    AVar14.memoryResource = pstd::pmr::new_delete_resource();
    channels.n = 1;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
    pbrt::Image::Image((Image *)&local_148,Float,resolution,channels,&local_258,AVar14);
    if (local_248._0_8_ != (long)local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if (0 < (int)local_470._8_4_) {
      lVar25 = 0;
      pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_470._0_8_;
      do {
        local_470._4_4_ = (undefined4)((ulong)pIVar4 >> 0x20);
        bVar10 = 0 < (int)local_470._4_4_;
        local_470._0_8_ = pIVar4;
        if (bVar10) {
          uVar18 = 0;
          do {
            if ((int)(uint)local_460.nStored < 1) {
              fVar26 = 0.0;
            }
            else {
              uVar23 = (ulong)((uint)local_460.nStored & 0x7fffffff);
              piVar17 = &(local_648.values
                          [(local_648.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                           local_648.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) *
                           ((int)lVar25 - local_648.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                           ((int)uVar18 - local_648.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x)].
                          super__Vector_base<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->n;
              fVar26 = 0.0;
              do {
                fVar26 = (float)((double)((ulong)(1 < *piVar17) *
                                         (long)((double)piVar17[-1] / (double)(*piVar17 + -1))) +
                                (double)fVar26);
                piVar17 = piVar17 + 3;
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
            }
            pbrt::Image::SetChannel
                      ((Image *)&local_148,(Point2i)(lVar25 << 0x20 | uVar18),0,
                       fVar26 / (float)(int)(uint)local_460.nStored);
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 < (long)(int)local_470._4_4_);
        }
        lVar25 = lVar25 + 1;
        pIVar4 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_470._0_8_;
      } while (lVar25 < (int)local_470._8_4_);
    }
    auVar2._4_4_ = in_XMM3_Db;
    auVar2._0_4_ = in_XMM3_Da;
    auVar2._8_8_ = in_XMM3_Qb;
    vcvtusi2sd_avx512f(auVar2,((long)local_6a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_6a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
    printf("%s estimate = %.9g\n",local_670._M_dataplus._M_p);
    if (local_5e8._M_string_length == 0) {
      uVar19 = 0;
    }
    else {
      _Stack_178._M_impl.super__Rb_tree_header._M_header._M_left =
           &_Stack_178._M_impl.super__Rb_tree_header._M_header;
      local_188 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )0x0;
      uStack_180 = 0;
      _Stack_178._M_impl._0_8_ = 0;
      _Stack_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_178._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      _Stack_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1c8 = 0;
      auStack_1c0 = (undefined1  [8])0x0;
      aStack_1b8._0_8_ = 0;
      aStack_1b8._8_8_ = 0;
      uStack_1a8 = 0;
      auStack_1a0 = (undefined1  [8])0x0;
      oStack_198.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
      oStack_198.set = false;
      oStack_198._5_3_ = 0;
      oStack_190.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      oStack_190.set = false;
      oStack_190._5_3_ = 0;
      local_248._64_8_ = 0;
      uStack_200 = 0;
      uStack_1f8 = 0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      uStack_1e0 = 0;
      uStack_1d8 = 0;
      uStack_1d0 = 0;
      local_248._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      local_248[4] = false;
      local_248._5_3_ = 0;
      local_248._8_4_ = 0;
      local_248._12_4_ = 0;
      local_248._16_8_ = 0;
      local_248._24_8_ = 0;
      local_248._32_8_ = 0;
      local_248._40_8_ = 0;
      local_248._48_8_ = 0;
      local_248._56_8_ = 0;
      _Stack_178._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_178._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_178._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar10 = pbrt::Image::Write((Image *)&local_148,&local_5e8,(ImageMetadata *)local_248);
      uVar19 = (uint)!bVar10;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&_Stack_178);
      if (uStack_180._0_1_ == true) {
        uStack_180 = uStack_180 & 0xffffffffffffff00;
      }
      if (oStack_190.set == true) {
        oStack_190.set = false;
      }
      if (oStack_198.set == true) {
        oStack_198.set = false;
      }
      if ((bool)auStack_1a0[4] == true) {
        auStack_1a0[4] = 0;
      }
      if (uStack_1a8._0_1_ == true) {
        uStack_1a8 = uStack_1a8 & 0xffffffffffffff00;
      }
      if ((bool)auStack_1c0[4] == true) {
        auStack_1c0[4] = 0;
      }
      if (uStack_200._0_1_ == true) {
        uStack_200 = uStack_200 & 0xffffffffffffff00;
      }
      if ((bool)local_248[4] == true) {
        local_248[4] = 0;
      }
    }
    local_38 = 0;
    (**(code **)(*local_50 + 0x18))(local_50,local_48,local_40 << 2,4);
    local_58 = 0;
    (**(code **)(*local_70 + 0x18))(local_70,local_68,local_60 * 2,2);
    local_78 = 0;
    (**(code **)(*local_90 + 0x18))(local_90,local_88,local_80,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&IStack_138);
    pbrt::
    Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
    ::~Array2D(&local_648);
LAB_001f1186:
    if ((uint *)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_570.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_570.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_570.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
    ::~vector(&local_5a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_288);
    if (local_290 == true) {
      local_290 = false;
    }
    if (local_29c == true) {
      local_29c = false;
    }
    if (local_2a4 == true) {
      local_2a4 = false;
    }
    if (local_2ac == true) {
      local_2ac = false;
    }
    if (local_2b8 == true) {
      local_2b8 = false;
    }
    if (local_2cc == true) {
      local_2cc = false;
    }
    if (local_310 == true) {
      local_310 = false;
    }
    if (local_354 == true) {
      local_354 = false;
    }
    local_360 = 0;
    (*(local_378.memoryResource)->_vptr_memory_resource[3])
              (local_378.memoryResource,local_370,local_368 << 2,4);
    local_380 = 0;
    (*(local_398.memoryResource)->_vptr_memory_resource[3])
              (local_398.memoryResource,local_390,local_388 * 2,2);
    local_3a0 = 0;
    (*(local_3b8.memoryResource)->_vptr_memory_resource[3])
              (local_3b8.memoryResource,local_3b0,local_3a8,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_460);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,
                    CONCAT71(local_608.field_2._M_allocated_capacity._1_7_,
                             local_608.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,
                    CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                             local_5e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,
                    CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                             local_590.field_2._M_local_buf[0]) + 1);
  }
  return uVar19;
}

Assistant:

int error(int argc, char *argv[]) {
    std::string referenceFile, errorFile, metric = "MSE";
    std::string filenameBase;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("error", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "errorfile", &errorFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("error", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("error", "Must provide base filename.");
    if (metric != "MSE" && metric != "MRSE" && metric != "L1")
        usage("error", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    if (referenceFile.empty())
        usage("error", "must provide --reference file.");
    ImageAndMetadata ref = Image::Read(referenceFile);
    Image &referenceImage = ref.image;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    auto crop = [&cropWindow](Image &image) {
        if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
            image = image.Crop(
                Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
    };

    crop(referenceImage);

    // Compute error and error image
    using MultiChannelVarianceEstimator = std::vector<VarianceEstimator<double>>;
    std::vector<Array2D<MultiChannelVarianceEstimator>> pixelVariances(MaxThreadIndex());
    for (auto &amcve : pixelVariances) {
        amcve = Array2D<MultiChannelVarianceEstimator>(referenceImage.Resolution().x,
                                                       referenceImage.Resolution().y);
        for (auto &mcve : amcve)
            mcve.resize(referenceImage.NChannels());
    }

    std::vector<double> sumErrors(MaxThreadIndex(), 0.);
    std::vector<int> spp(filenames.size());
    std::atomic<bool> failed{false};
    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;
        crop(im);

        CHECK(imRead.metadata.samplesPerPixel.has_value());
        spp[i] = *imRead.metadata.samplesPerPixel;

        Image diffImage;
        ImageChannelValues error(referenceImage.NChannels());
        if (metric == "L1")
            error = im.L1Error(im.AllChannelsDesc(), referenceImage, &diffImage);
        else if (metric == "MSE")
            error = im.MSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        else
            error = im.MRSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        sumErrors[ThreadIndex] += error.Average();

        for (int y = 0; y < im.Resolution().y; ++y)
            for (int x = 0; x < im.Resolution().x; ++x) {
                MultiChannelVarianceEstimator &pixelVariance =
                    pixelVariances[ThreadIndex](x, y);
                for (int c = 0; c < im.NChannels(); ++c)
                    if (metric == "MRSE")
                        pixelVariance[c].Add(
                            im.GetChannel({x, y}, c) /
                            (0.01f + referenceImage.GetChannel({x, y}, c)));
                    else
                        pixelVariance[c].Add(im.GetChannel({x, y}, c));
            }
    });

    for (int i = 1; i < filenames.size(); ++i) {
        if (spp[i] != spp[0]) {
            printf("%s: spp %d mismatch. %s has %d.\n", filenames[i].c_str(), spp[i],
                   filenames[0].c_str(), spp[0]);
            return 1;
        }
    }

    if (failed)
        return 1;

    double sumError = std::accumulate(sumErrors.begin(), sumErrors.end(), 0.);

    Array2D<MultiChannelVarianceEstimator> pixelVariance(referenceImage.Resolution().x,
                                                         referenceImage.Resolution().y);
    for (auto &mcve : pixelVariance)
        mcve.resize(referenceImage.NChannels());

    for (const auto &pixVar : pixelVariances)
        for (int y = 0; y < referenceImage.Resolution().y; ++y)
            for (int x = 0; x < referenceImage.Resolution().x; ++x)
                for (int c = 0; c < referenceImage.NChannels(); ++c)
                    pixelVariance(x, y)[c].Merge(pixVar(x, y)[c]);

    Image errorImage(PixelFormat::Float,
                     {referenceImage.Resolution().x, referenceImage.Resolution().y},
                     {metric});
    for (int y = 0; y < referenceImage.Resolution().y; ++y)
        for (int x = 0; x < referenceImage.Resolution().x; ++x) {
            Float varSum = 0;
            for (int c = 0; c < referenceImage.NChannels(); ++c)
                varSum += pixelVariance(x, y)[c].Variance();
            errorImage.SetChannel({x, y}, 0, varSum / referenceImage.NChannels());
        }

    // MSE is the average over all of the pixels
    double error = sumError / (filenames.size() - 1);
    printf("%s estimate = %.9g\n", metric.c_str(), error);

    if (!errorFile.empty() && !errorImage.Write(errorFile)) {
        return 1;
    }

    return 0;
}